

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

ssize_t __thiscall fmt::v5::file::read(file *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  int *piVar2;
  system_error *this_00;
  undefined4 in_register_00000034;
  string_view message;
  
  do {
    sVar1 = ::read(this->fd_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    if (sVar1 != -1) {
      if (-1 < sVar1) {
        return sVar1;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x15;
  message.data_ = "cannot read from file";
  system_error::system_error<>(this_00,*piVar2,message);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t file::read(void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(read(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(system_error(errno, "cannot read from file"));
  return internal::to_unsigned(result);
}